

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd64.cpp
# Opt level: O2

void stackjit::Amd64Backend::moveMemoryRegWithIntOffsetToReg
               (CodeGen *codeGen,FloatRegisters dest,ExtendedRegisters srcMemReg,int offset)

{
  size_t i;
  long lVar1;
  IntToBytes converter;
  ExtendedRegisters local_29;
  uchar local_28 [4];
  int local_24;
  
  local_28[3] = 0xf3;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (codeGen,local_28 + 3);
  local_28[2] = 0x41;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (codeGen,local_28 + 2);
  local_28[1] = 0xf;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (codeGen,local_28 + 1);
  local_28[0] = '\x10';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (codeGen,local_28);
  local_29 = dest << 3 | srcMemReg | 0x80;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (codeGen,&local_29);
  local_24 = offset;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (codeGen,(value_type_conflict2 *)((long)&local_24 + lVar1));
  }
  return;
}

Assistant:

void Amd64Backend::moveMemoryRegWithIntOffsetToReg(CodeGen& codeGen, FloatRegisters dest, ExtendedRegisters srcMemReg, int offset) {
		codeGen.push_back(0xf3);
		codeGen.push_back(0x41);
		codeGen.push_back(0x0f);
		codeGen.push_back(0x10);
		codeGen.push_back(0x80 | (Byte)srcMemReg | ((Byte)dest << 3));

		IntToBytes converter;
		converter.intValue = offset;

		for (std::size_t i = 0; i < sizeof(int); i++) {
			codeGen.push_back(converter.byteValues[i]);
		}
	}